

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tn93_shared.cc
# Opt level: O1

sequence_gap_structure *
describe_sequence(sequence_gap_structure *__return_storage_ptr__,char *source,
                 unsigned_long sequence_length,unsigned_long char_count)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  
  uVar3 = 0x7fffffffffffffff;
  __return_storage_ptr__->first_nongap = 0x7fffffffffffffff;
  uVar1 = sequence_length + 1;
  __return_storage_ptr__->last_nongap = 0;
  __return_storage_ptr__->resolved_start = 0;
  __return_storage_ptr__->resolved_end = 0;
  __return_storage_ptr__->resolved_start = uVar1;
  uVar6 = uVar1;
  uVar7 = uVar1;
  if (sequence_length == 0) {
    uVar5 = 0;
    uVar8 = 0;
    uVar2 = 0;
  }
  else {
    uVar10 = 0;
    uVar2 = 0;
    uVar8 = 0;
    uVar5 = 0;
    uVar4 = uVar3;
    do {
      uVar3 = uVar4;
      if (uVar10 < uVar4) {
        uVar3 = uVar10;
      }
      uVar9 = uVar8;
      if (uVar8 < uVar10) {
        uVar9 = uVar10;
      }
      if ((long)source[uVar10] == 0x11) {
        uVar3 = uVar4;
        uVar9 = uVar8;
      }
      uVar8 = uVar9;
      if ((ulong)(long)source[uVar10] < char_count) {
        uVar2 = uVar10;
        if (uVar10 < uVar6) {
          uVar6 = uVar10;
        }
      }
      else {
        if (((long)uVar6 <= (long)uVar2) && ((long)(uVar5 - uVar7) < (long)(uVar2 - uVar6))) {
          uVar5 = uVar2;
          uVar7 = uVar6;
        }
        uVar2 = 0;
        uVar6 = uVar1;
      }
      uVar10 = uVar10 + 1;
      uVar4 = uVar3;
    } while (sequence_length != uVar10);
  }
  __return_storage_ptr__->first_nongap = uVar3;
  __return_storage_ptr__->last_nongap = uVar8;
  __return_storage_ptr__->resolved_end = uVar5;
  __return_storage_ptr__->resolved_start = uVar7;
  if (((long)uVar6 <= (long)uVar2) &&
     (__return_storage_ptr__->resolved_end - __return_storage_ptr__->resolved_start <
      (long)(uVar2 - uVar6))) {
    __return_storage_ptr__->resolved_start = uVar6;
    __return_storage_ptr__->resolved_end = uVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

struct sequence_gap_structure describe_sequence (const char* source, const unsigned long sequence_length, const unsigned long char_count) {
  sequence_gap_structure result;
  
  long start_run = sequence_length + 1UL,
       end_run = 0L;
  
  result.resolved_end = end_run;
  result.resolved_start = start_run;
  
  for (unsigned long char_idx = 0UL; char_idx < sequence_length; char_idx++) {
    unsigned long this_char = source[char_idx];
    if (this_char != GAP) {
      if (char_idx < result.first_nongap) {
        result.first_nongap = char_idx;
      }
      if (char_idx > result.last_nongap) {
        result.last_nongap = char_idx;
      }
      
    }
    if (this_char < char_count) { // not an ambig
      if (char_idx < start_run) {
        end_run = start_run = char_idx;
      } else {
        end_run = char_idx;
      }
    } else { // an ambig
      if (end_run >= start_run) {
        if (end_run - start_run > result.resolved_end - result.resolved_start) {
          result.resolved_start = start_run;
          result.resolved_end = end_run;
        }
      }
      start_run = sequence_length + 1UL;
      end_run = 0L;
    }
  }
  if (end_run >= start_run) {
    if (end_run - start_run > result.resolved_end - result.resolved_start) {
      result.resolved_start = start_run;
      result.resolved_end = end_run;
    }
  }
  
  //cout << sequence_length << "/" << char_count << endl << result.first_nongap << "," 
  //     << result.last_nongap << " : " << result.resolved_start << "," << result.resolved_end << endl;
  
  return result;
}